

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Output.cpp
# Opt level: O3

size_t Output::VTrace(char16 *shortPrefixFormat,char16 *prefix,char16 *form,__va_list_tag *argptr)

{
  undefined4 *puVar1;
  code *pcVar2;
  bool bVar3;
  int iVar4;
  uint uVar5;
  size_t sVar6;
  size_t sVar7;
  long lVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  undefined8 *in_FS_OFFSET;
  WCHAR local_218 [4];
  char16 callStackMsg [182];
  void *frames [10];
  char16 callStackPrefix [12];
  
  sVar6 = Print(shortPrefixFormat);
  sVar7 = VPrint(form,argptr);
  sVar7 = sVar7 + sVar6;
  if (s_stackTraceHelper == (IStackTraceHelper *)0x0) {
    return sVar7;
  }
  frames[9]._0_2_ = L'c';
  frames[9]._2_2_ = L'a';
  frames[9]._4_2_ = L'l';
  frames[9]._6_2_ = L'l';
  if (s_inMemoryLogger == (ILogger *)0x0) {
    sVar6 = Print(L"%s\n",frames + 9);
    lVar8 = (*(code *)**(undefined8 **)s_stackTraceHelper)(s_stackTraceHelper,2,10);
    return lVar8 + sVar6 + sVar7;
  }
  iVar4 = _snwprintf_unsafe(local_218,0xb6,0xffffffffffffffff,L"%s",frames + 9);
  if (iVar4 == -1) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar1 = (undefined4 *)*in_FS_OFFSET;
    *puVar1 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Core/Output.cpp"
                       ,0xc3,"(temp != -1)","temp != -1");
    if (!bVar3) goto LAB_001f4726;
    *puVar1 = 0;
  }
  uVar5 = (**(code **)(*(long *)s_stackTraceHelper + 8))
                    (s_stackTraceHelper,2,10,callStackMsg + 0xb4);
  if (uVar5 < 0xb) {
    if (uVar5 == 0) goto LAB_001f46f5;
  }
  else {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar1 = (undefined4 *)*in_FS_OFFSET;
    *puVar1 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Core/Output.cpp"
                       ,199,"(framesObtained <= c_frameCount)","framesObtained <= c_frameCount");
    if (!bVar3) {
LAB_001f4726:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar1 = 0;
  }
  uVar9 = (ulong)iVar4;
  uVar10 = 10;
  if (uVar5 < 10) {
    uVar10 = (ulong)uVar5;
  }
  puVar1 = (undefined4 *)*in_FS_OFFSET;
  uVar11 = 0;
  do {
    if (0xb6 < uVar9) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *puVar1 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Core/Output.cpp"
                         ,0xca,"((sizeof(*__countof_helper(callStackMsg)) + 0) >= start)",
                         "_countof(callStackMsg) >= start");
      if (!bVar3) goto LAB_001f4726;
      *puVar1 = 0;
    }
    iVar4 = _snwprintf_unsafe(callStackMsg + (uVar9 - 4),0xb6 - uVar9,0xffffffffffffffff,L" %p",
                              *(undefined8 *)(callStackMsg + uVar11 * 4 + 0xb4));
    if (iVar4 == -1) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *puVar1 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Core/Output.cpp"
                         ,0xcc,"(temp != -1)","temp != -1");
      if (!bVar3) goto LAB_001f4726;
      *puVar1 = 0;
    }
    uVar9 = uVar9 + (long)iVar4;
    uVar11 = uVar11 + 1;
  } while (uVar10 != uVar11);
LAB_001f46f5:
  sVar6 = Print(L"%s\n",local_218);
  return sVar6 + sVar7;
}

Assistant:

size_t
Output::VTrace(const char16* shortPrefixFormat, const char16* prefix, const char16 *form, va_list argptr)
{
    size_t retValue = 0;

#if CONFIG_RICH_TRACE_FORMAT
    if (CONFIG_FLAG(RichTraceFormat))
    {
        InterlockedIncrement(&s_traceEntryId);
        retValue += Output::Print(_u("[%d ~%d %s] "), s_traceEntryId, ::GetCurrentThreadId(), prefix);
    }
    else
#endif
    {
        retValue += Output::Print(shortPrefixFormat, prefix);
    }
    retValue += Output::VPrint(form, argptr);

#ifdef STACK_BACK_TRACE
    // Print stack trace.
    if (s_stackTraceHelper)
    {
        const ULONG c_framesToSkip = 2; // Skip 2 frames -- Output::VTrace and Output::Trace.
        const ULONG c_frameCount = 10;  // TODO: make it configurable.
        const char16 callStackPrefix[] = _u("call stack:");
        if (s_inMemoryLogger)
        {
            // Trace just addresses of functions, avoid symbol info as it takes too much memory.
            // One line for whole stack trace for easier parsing on the jd side.
            const size_t c_msgCharCount = _countof(callStackPrefix) + (1 + sizeof(void*) * 2) * c_frameCount; // 2 hexadecimal digits per byte + 1 for space.
            char16 callStackMsg[c_msgCharCount];
            void* frames[c_frameCount];
            size_t start = 0;
            size_t temp;

            temp = _snwprintf_s(callStackMsg, _countof(callStackMsg), _TRUNCATE, _u("%s"), callStackPrefix);
            Assert(temp != -1);
            start += temp;

            ULONG framesObtained = s_stackTraceHelper->GetStackTrace(c_framesToSkip, c_frameCount, frames);
            Assert(framesObtained <= c_frameCount);
            for (ULONG i = 0; i < framesObtained && i < c_frameCount; ++i)
            {
                Assert(_countof(callStackMsg) >= start);
                temp = _snwprintf_s(callStackMsg + start, _countof(callStackMsg) - start, _TRUNCATE, _u(" %p"), frames[i]);
                Assert(temp != -1);
                start += temp;
            }

            retValue += Output::Print(_u("%s\n"), callStackMsg);
        }
        else
        {
            // Trace with full symbol info.
            retValue += Output::Print(_u("%s\n"), callStackPrefix);
            retValue += s_stackTraceHelper->PrintStackTrace(c_framesToSkip, c_frameCount);
        }
    }
#endif

    return retValue;
}